

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

int dialer_set(nng_dialer id,char *n,void *v,size_t sz,nni_type t)

{
  int iVar1;
  nni_dialer *in_RAX;
  nni_dialer *local_38;
  nni_dialer *d;
  
  local_38 = in_RAX;
  iVar1 = nni_dialer_find(&local_38,id.id);
  if (iVar1 == 0) {
    iVar1 = nni_dialer_setopt(local_38,n,v,sz,t);
    nni_dialer_rele(local_38);
  }
  return iVar1;
}

Assistant:

static int
dialer_set(nng_dialer id, const char *n, const void *v, size_t sz, nni_type t)
{
	nni_dialer *d;
	int         rv;

	if ((rv = nni_dialer_find(&d, id.id)) != 0) {
		return (rv);
	}
	rv = nni_dialer_setopt(d, n, v, sz, t);
	nni_dialer_rele(d);
	return (rv);
}